

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O3

void __thiscall psy::C::SemanticModelTester::case0304(SemanticModelTester *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SyntaxNode *this_00;
  SyntaxKind SVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  TagDeclarationSymbol *this_01;
  TagType *pTVar5;
  Lexeme *pLVar6;
  undefined8 uVar7;
  ostream *poVar8;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  SemanticModel *local_30;
  TestSuite *local_28;
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "\nstruct x\n{\n    struct y\n    {\n        struct z { int _ ; } w;\n    } u ;\n} ;\n"
             ,"");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  compile<psy::C::StructOrUnionDeclarationSyntax>
            ((SemanticModelTester *)&stack0xffffffffffffffd0,(string *)this,&local_70);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  lVar4 = (**(code **)(**(long **)(local_28[5]._vptr_TestSuite[7] + 8) + 0xe0))();
  lVar4 = (**(code **)(**(long **)(*(long *)(lVar4 + 0x28) + 8) + 0x1b0))();
  lVar4 = (**(code **)(**(long **)(*(long *)(*(long *)(*(long *)(lVar4 + 0x18) + 0x28) + 0x38) + 8)
                      + 0xe0))();
  lVar4 = (**(code **)(**(long **)(*(long *)(lVar4 + 0x28) + 8) + 0x1b0))();
  this_00 = *(SyntaxNode **)(lVar4 + 0x18);
  SVar2 = SyntaxNode::kind(this_00);
  if (SVar2 == StructDeclaration) {
    iVar3 = (*(this_00->super_Managed)._vptr_Managed[0xf])(this_00);
    this_01 = (TagDeclarationSymbol *)
              SemanticModel::structFor
                        (local_30,(StructOrUnionDeclarationSyntax *)CONCAT44(extraout_var,iVar3));
    if (this_01 != (TagDeclarationSymbol *)0x0) {
      pTVar5 = TagDeclarationSymbol::introducedNewType(this_01);
      pLVar6 = &TagType::tag(pTVar5)->super_Lexeme;
      Lexeme::valueText_abi_cxx11_(&local_70,pLVar6);
      iVar3 = std::__cxx11::string::compare((char *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (iVar3 == 0) {
        return;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n!\tFAIL\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\tActual  : ",0xc)
      ;
      pTVar5 = TagDeclarationSymbol::introducedNewType(this_01);
      pLVar6 = &TagType::tag(pTVar5)->super_Lexeme;
      Lexeme::valueText_abi_cxx11_(&local_70,pLVar6);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\tExpected: ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"z",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                 ,99);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x217);
      std::endl<char,std::char_traits<char>>(poVar8);
      std::__cxx11::string::~string((string *)&local_70);
      goto LAB_003dfec9;
    }
    poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar8 = std::operator<<(poVar8,"\t\tExpression is NOT ");
    poVar8 = std::operator<<(poVar8,"true");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\t");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    iVar3 = 0x216;
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
    SVar2 = SyntaxNode::kind(this_00);
    poVar8 = C::operator<<(poVar8,SVar2);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
    poVar8 = C::operator<<(poVar8,StructDeclaration);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\t");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    iVar3 = 0x212;
  }
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar3);
  std::endl<char,std::char_traits<char>>(poVar8);
LAB_003dfec9:
  uVar7 = __cxa_allocate_exception(1);
  __cxa_throw(uVar7,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0304()
{
    auto [tyDeclNode, semaModel] =
            compile<StructOrUnionDeclarationSyntax>(R"(
struct x
{
    struct y
    {
        struct z { int _ ; } w;
    } u ;
} ;
)");

    auto tySpec = tyDeclNode->typeSpecifier();
    auto fldDecl0 = tySpec->declarations()->value->asFieldDeclaration();
    auto nestedtyDeclNode = fldDecl0->specifiers()->value->asTagDeclarationAsSpecifier()->tagDeclaration();

    auto nestedTySpec = nestedtyDeclNode->typeSpecifier();
    auto nestedFldDecl0 = nestedTySpec->declarations()->value->asFieldDeclaration();
    auto nestedNestedtyDeclNode = nestedFldDecl0->specifiers()->value->asTagDeclarationAsSpecifier()->tagDeclaration();
    PSY_EXPECT_EQ_ENU(nestedNestedtyDeclNode->kind(),
                      SyntaxKind::StructDeclaration,
                      SyntaxKind);

    const StructDeclarationSymbol* strukt =
            semaModel->structFor(nestedNestedtyDeclNode->asStructOrUnionDeclaration());
    PSY_EXPECT_TRUE(strukt);
    PSY_EXPECT_EQ_STR(strukt->introducedNewType()->tag()->valueText(), "z");
}